

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O3

void av1_fwd_txfm2d_4x16_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  ulong *puVar1;
  int32_t *piVar2;
  int32_t *piVar3;
  int32_t *piVar4;
  ulong *puVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  code *pcVar10;
  uint uVar11;
  int32_t iVar12;
  int32_t iVar13;
  int32_t iVar14;
  int32_t iVar15;
  int32_t iVar16;
  int32_t iVar17;
  int32_t iVar18;
  int32_t iVar19;
  int32_t iVar20;
  int32_t iVar21;
  bool bVar22;
  int8_t *piVar23;
  long lVar24;
  undefined7 in_register_00000009;
  long lVar25;
  long lVar26;
  int i;
  int iVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  __m128i tmp [4];
  int local_178 [2];
  undefined8 uStack_170;
  int local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  int local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  int local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  int local_138;
  undefined4 uStack_134;
  int32_t aiStack_130 [2];
  int local_128;
  int32_t aiStack_124 [3];
  int local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  int local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  int local_f8;
  undefined4 uStack_f4;
  int32_t aiStack_f0 [2];
  int local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  int local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  int local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  int local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  int local_a8;
  int32_t aiStack_a4 [3];
  int local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  int local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined8 local_78 [2];
  int32_t aiStack_68 [14];
  
  piVar23 = av1_fwd_txfm_shift_ls[0xd];
  uVar11 = (uint)CONCAT71(in_register_00000009,tx_type);
  pcVar10 = *(code **)((long)row_highbd_txfm4x4_arr + (ulong)(uVar11 * 8));
  bVar22 = true;
  if (uVar11 < 0x10) {
    if ((0x4110U >> (uVar11 & 0x1f) & 1) != 0) {
LAB_0042611d:
      local_88 = (int)*av1_fwd_txfm_shift_ls[0xd];
      puVar1 = (ulong *)(input + stride * 8);
      puVar5 = (ulong *)((long)puVar1 + (long)(stride * 4) * 2);
      lVar25 = (long)(stride * 3);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = *(ulong *)((long)puVar5 + lVar25 * 2);
      lVar26 = (long)(stride * 2);
      auVar45._8_8_ = 0;
      auVar45._0_8_ = *(ulong *)((long)puVar5 + lVar26 * 2);
      lVar24 = (long)stride;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = *(ulong *)((long)puVar5 + lVar24 * 2);
      auVar51._8_8_ = 0;
      auVar51._0_8_ = *puVar5;
      if (!bVar22) {
        auVar32 = pshuflw(auVar32,auVar32,0x1b);
        auVar45 = pshuflw(auVar45,auVar45,0x1b);
        auVar53 = pshuflw(auVar53,auVar53,0x1b);
        auVar51 = pshuflw(auVar51,auVar51,0x1b);
      }
      auVar32 = pmovsxwd(in_XMM4,auVar32);
      auVar45 = pmovsxwd(auVar45,auVar45);
      auVar53 = pmovsxwd(auVar53,auVar53);
      local_178[0] = auVar32._0_4_ << local_88;
      local_178[1] = auVar32._4_4_;
      uStack_170._0_4_ = auVar32._8_4_;
      uStack_170._4_4_ = auVar32._12_4_;
      auVar32 = pmovsxwd(auVar51,auVar51);
      local_168 = auVar45._0_4_ << local_88;
      uStack_164 = auVar45._4_4_;
      uStack_160 = auVar45._8_4_;
      uStack_15c = auVar45._12_4_;
      local_158 = auVar53._0_4_ << local_88;
      uStack_154 = auVar53._4_4_;
      uStack_150 = auVar53._8_4_;
      uStack_14c = auVar53._12_4_;
      local_148 = auVar32._0_4_ << local_88;
      uStack_144 = auVar32._4_4_;
      uStack_140 = auVar32._8_4_;
      uStack_13c = auVar32._12_4_;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = *(ulong *)((long)puVar1 + lVar25 * 2);
      auVar42._8_8_ = 0;
      auVar42._0_8_ = *(ulong *)((long)puVar1 + lVar26 * 2);
      auVar49._8_8_ = 0;
      auVar49._0_8_ = *(ulong *)((long)puVar1 + lVar24 * 2);
      auVar55._8_8_ = 0;
      auVar55._0_8_ = *puVar1;
      if (!bVar22) {
        auVar36 = pshuflw(auVar36,auVar36,0x1b);
        auVar42 = pshuflw(auVar42,auVar42,0x1b);
        auVar49 = pshuflw(auVar49,auVar49,0x1b);
        auVar55 = pshuflw(auVar55,auVar55,0x1b);
      }
      auVar32 = pmovsxwd(auVar36,auVar36);
      auVar51 = pmovsxwd(auVar42,auVar42);
      auVar45 = pmovsxwd(auVar49,auVar49);
      auVar53 = pmovsxwd(auVar55,auVar55);
      local_138 = auVar32._0_4_ << local_88;
      uStack_134 = auVar32._4_4_;
      aiStack_130[0] = auVar32._8_4_;
      aiStack_130[1] = auVar32._12_4_;
      local_128 = auVar51._0_4_ << local_88;
      aiStack_124[0] = auVar51._4_4_;
      aiStack_124[1] = auVar51._8_4_;
      aiStack_124[2] = auVar51._12_4_;
      local_118 = auVar45._0_4_ << local_88;
      uStack_114 = auVar45._4_4_;
      uStack_110 = auVar45._8_4_;
      uStack_10c = auVar45._12_4_;
      local_108 = auVar53._0_4_ << local_88;
      uStack_104 = auVar53._4_4_;
      uStack_100 = auVar53._8_4_;
      uStack_fc = auVar53._12_4_;
      puVar1 = (ulong *)(input + stride * 4);
      auVar56._8_8_ = 0;
      auVar56._0_8_ = *(ulong *)((long)puVar1 + lVar25 * 2);
      auVar50._8_8_ = 0;
      auVar50._0_8_ = *(ulong *)((long)puVar1 + lVar26 * 2);
      auVar43._8_8_ = 0;
      auVar43._0_8_ = *(ulong *)((long)puVar1 + lVar24 * 2);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = *puVar1;
      if (!bVar22) {
        auVar56 = pshuflw(auVar56,auVar56,0x1b);
        auVar50 = pshuflw(auVar50,auVar50,0x1b);
        auVar43 = pshuflw(auVar43,auVar43,0x1b);
        auVar37 = pshuflw(auVar37,auVar37,0x1b);
      }
      auVar32 = pmovsxwd(auVar56,auVar56);
      auVar45 = pmovsxwd(auVar50,auVar50);
      auVar51 = pmovsxwd(auVar43,auVar43);
      local_f8 = auVar32._0_4_ << local_88;
      uStack_f4 = auVar32._4_4_;
      aiStack_f0[0] = auVar32._8_4_;
      aiStack_f0[1] = auVar32._12_4_;
      auVar32 = pmovsxwd(auVar37,auVar37);
      local_e8 = auVar45._0_4_ << local_88;
      uStack_e4 = auVar45._4_4_;
      uStack_e0 = auVar45._8_4_;
      uStack_dc = auVar45._12_4_;
      local_d8 = auVar51._0_4_ << local_88;
      uStack_d4 = auVar51._4_4_;
      uStack_d0 = auVar51._8_4_;
      uStack_cc = auVar51._12_4_;
      local_c8 = auVar32._0_4_ << local_88;
      uStack_c4 = auVar32._4_4_;
      uStack_c0 = auVar32._8_4_;
      uStack_bc = auVar32._12_4_;
      uVar6 = *(ulong *)(input + lVar25);
      uVar7 = *(ulong *)(input + lVar26);
      uVar8 = *(ulong *)(input + lVar24);
      uVar9 = *(ulong *)input;
      goto LAB_004262c7;
    }
    if ((0x80a0U >> (uVar11 & 0x1f) & 1) == 0) {
      if (uVar11 == 6) {
        bVar22 = false;
        goto LAB_0042611d;
      }
    }
    else {
      bVar22 = false;
    }
  }
  local_88 = (int)*av1_fwd_txfm_shift_ls[0xd];
  puVar1 = (ulong *)(input + stride * 4);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)input;
  lVar25 = (long)stride;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(input + lVar25);
  lVar26 = (long)(stride * 2);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(input + lVar26);
  lVar24 = (long)(stride * 3);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(input + lVar24);
  if (!bVar22) {
    auVar28 = pshuflw(auVar28,auVar28,0x1b);
    auVar31 = pshuflw(auVar31,auVar31,0x1b);
    auVar44 = pshuflw(auVar44,auVar44,0x1b);
    auVar38 = pshuflw(auVar38,auVar38,0x1b);
  }
  puVar5 = (ulong *)(input + stride * 8);
  auVar51 = pmovsxwd(in_XMM4,auVar28);
  auVar32 = pmovsxwd(auVar31,auVar31);
  auVar45 = pmovsxwd(auVar44,auVar44);
  local_178[0] = auVar51._0_4_ << local_88;
  local_178[1] = auVar51._4_4_;
  uStack_170._0_4_ = auVar51._8_4_;
  uStack_170._4_4_ = auVar51._12_4_;
  auVar51 = pmovsxwd(auVar38,auVar38);
  local_168 = auVar32._0_4_ << local_88;
  uStack_164 = auVar32._4_4_;
  uStack_160 = auVar32._8_4_;
  uStack_15c = auVar32._12_4_;
  local_158 = auVar45._0_4_ << local_88;
  uStack_154 = auVar45._4_4_;
  uStack_150 = auVar45._8_4_;
  uStack_14c = auVar45._12_4_;
  local_148 = auVar51._0_4_ << local_88;
  uStack_144 = auVar51._4_4_;
  uStack_140 = auVar51._8_4_;
  uStack_13c = auVar51._12_4_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *puVar1;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)((long)puVar1 + lVar25 * 2);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)((long)puVar1 + lVar26 * 2);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)((long)puVar1 + lVar24 * 2);
  if (!bVar22) {
    auVar33 = pshuflw(auVar33,auVar33,0x1b);
    auVar39 = pshuflw(auVar39,auVar39,0x1b);
    auVar46 = pshuflw(auVar46,auVar46,0x1b);
    auVar52 = pshuflw(auVar52,auVar52,0x1b);
  }
  auVar32 = pmovsxwd(auVar33,auVar33);
  auVar51 = pmovsxwd(auVar39,auVar39);
  auVar45 = pmovsxwd(auVar46,auVar46);
  auVar53 = pmovsxwd(auVar52,auVar52);
  local_138 = auVar32._0_4_ << local_88;
  uStack_134 = auVar32._4_4_;
  aiStack_130[0] = auVar32._8_4_;
  aiStack_130[1] = auVar32._12_4_;
  local_128 = auVar51._0_4_ << local_88;
  aiStack_124[0] = auVar51._4_4_;
  aiStack_124[1] = auVar51._8_4_;
  aiStack_124[2] = auVar51._12_4_;
  local_118 = auVar45._0_4_ << local_88;
  uStack_114 = auVar45._4_4_;
  uStack_110 = auVar45._8_4_;
  uStack_10c = auVar45._12_4_;
  local_108 = auVar53._0_4_ << local_88;
  uStack_104 = auVar53._4_4_;
  uStack_100 = auVar53._8_4_;
  uStack_fc = auVar53._12_4_;
  puVar1 = (ulong *)((long)puVar5 + (long)(stride * 4) * 2);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *puVar5;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)((long)puVar5 + lVar25 * 2);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)((long)puVar5 + lVar26 * 2);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)((long)puVar5 + lVar24 * 2);
  if (!bVar22) {
    auVar54 = pshuflw(auVar54,auVar54,0x1b);
    auVar47 = pshuflw(auVar47,auVar47,0x1b);
    auVar40 = pshuflw(auVar40,auVar40,0x1b);
    auVar34 = pshuflw(auVar34,auVar34,0x1b);
  }
  auVar32 = pmovsxwd(auVar54,auVar54);
  auVar45 = pmovsxwd(auVar47,auVar47);
  auVar51 = pmovsxwd(auVar40,auVar40);
  local_f8 = auVar32._0_4_ << local_88;
  uStack_f4 = auVar32._4_4_;
  aiStack_f0[0] = auVar32._8_4_;
  aiStack_f0[1] = auVar32._12_4_;
  auVar32 = pmovsxwd(auVar34,auVar34);
  local_e8 = auVar45._0_4_ << local_88;
  uStack_e4 = auVar45._4_4_;
  uStack_e0 = auVar45._8_4_;
  uStack_dc = auVar45._12_4_;
  local_d8 = auVar51._0_4_ << local_88;
  uStack_d4 = auVar51._4_4_;
  uStack_d0 = auVar51._8_4_;
  uStack_cc = auVar51._12_4_;
  local_c8 = auVar32._0_4_ << local_88;
  uStack_c4 = auVar32._4_4_;
  uStack_c0 = auVar32._8_4_;
  uStack_bc = auVar32._12_4_;
  uVar6 = *puVar1;
  uVar7 = *(ulong *)((long)puVar1 + lVar25 * 2);
  uVar8 = *(ulong *)((long)puVar1 + lVar26 * 2);
  uVar9 = *(ulong *)((long)puVar1 + lVar24 * 2);
LAB_004262c7:
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar8;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar7;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar6;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar9;
  if (!bVar22) {
    auVar35 = pshuflw(auVar35,auVar35,0x1b);
    auVar41 = pshuflw(auVar41,auVar41,0x1b);
    auVar48 = pshuflw(auVar48,auVar48,0x1b);
    auVar29 = pshuflw(auVar29,auVar29,0x1b);
  }
  auVar32 = pmovsxwd(auVar35,auVar35);
  auVar51 = pmovsxwd(auVar41,auVar41);
  auVar45 = pmovsxwd(auVar48,auVar48);
  local_b8 = auVar32._0_4_ << local_88;
  uStack_b4 = auVar32._4_4_;
  uStack_b0 = auVar32._8_4_;
  uStack_ac = auVar32._12_4_;
  auVar32 = pmovsxwd(auVar29,auVar29);
  local_a8 = auVar51._0_4_ << local_88;
  aiStack_a4[0] = auVar51._4_4_;
  aiStack_a4[1] = auVar51._8_4_;
  aiStack_a4[2] = auVar51._12_4_;
  local_98 = auVar45._0_4_ << local_88;
  uStack_94 = auVar45._4_4_;
  uStack_90 = auVar45._8_4_;
  uStack_8c = auVar45._12_4_;
  local_88 = auVar32._0_4_ << local_88;
  uStack_84 = auVar32._4_4_;
  uStack_80 = auVar32._8_4_;
  uStack_7c = auVar32._12_4_;
  (**(code **)((long)col_highbd_txfm8x16_arr + (ulong)(uVar11 * 8)))(local_178,coeff,0xd,1);
  iVar27 = 1 << (~piVar23[1] & 0x1fU);
  auVar32 = ZEXT416((uint)-(int)piVar23[1]);
  *coeff = *coeff + iVar27 >> auVar32;
  coeff[1] = coeff[1] + iVar27 >> auVar32;
  coeff[2] = coeff[2] + iVar27 >> auVar32;
  coeff[3] = coeff[3] + iVar27 >> auVar32;
  coeff[4] = coeff[4] + iVar27 >> auVar32;
  coeff[5] = coeff[5] + iVar27 >> auVar32;
  coeff[6] = coeff[6] + iVar27 >> auVar32;
  coeff[7] = coeff[7] + iVar27 >> auVar32;
  coeff[8] = coeff[8] + iVar27 >> auVar32;
  coeff[9] = coeff[9] + iVar27 >> auVar32;
  coeff[10] = coeff[10] + iVar27 >> auVar32;
  coeff[0xb] = coeff[0xb] + iVar27 >> auVar32;
  coeff[0xc] = coeff[0xc] + iVar27 >> auVar32;
  coeff[0xd] = coeff[0xd] + iVar27 >> auVar32;
  coeff[0xe] = coeff[0xe] + iVar27 >> auVar32;
  coeff[0xf] = coeff[0xf] + iVar27 >> auVar32;
  coeff[0x10] = coeff[0x10] + iVar27 >> auVar32;
  coeff[0x11] = coeff[0x11] + iVar27 >> auVar32;
  coeff[0x12] = coeff[0x12] + iVar27 >> auVar32;
  coeff[0x13] = coeff[0x13] + iVar27 >> auVar32;
  coeff[0x14] = coeff[0x14] + iVar27 >> auVar32;
  coeff[0x15] = coeff[0x15] + iVar27 >> auVar32;
  coeff[0x16] = coeff[0x16] + iVar27 >> auVar32;
  coeff[0x17] = coeff[0x17] + iVar27 >> auVar32;
  coeff[0x18] = coeff[0x18] + iVar27 >> auVar32;
  coeff[0x19] = coeff[0x19] + iVar27 >> auVar32;
  coeff[0x1a] = coeff[0x1a] + iVar27 >> auVar32;
  coeff[0x1b] = coeff[0x1b] + iVar27 >> auVar32;
  coeff[0x1c] = coeff[0x1c] + iVar27 >> auVar32;
  coeff[0x1d] = coeff[0x1d] + iVar27 >> auVar32;
  coeff[0x1e] = coeff[0x1e] + iVar27 >> auVar32;
  coeff[0x1f] = coeff[0x1f] + iVar27 >> auVar32;
  coeff[0x20] = coeff[0x20] + iVar27 >> auVar32;
  coeff[0x21] = coeff[0x21] + iVar27 >> auVar32;
  coeff[0x22] = coeff[0x22] + iVar27 >> auVar32;
  coeff[0x23] = coeff[0x23] + iVar27 >> auVar32;
  coeff[0x24] = coeff[0x24] + iVar27 >> auVar32;
  coeff[0x25] = coeff[0x25] + iVar27 >> auVar32;
  coeff[0x26] = coeff[0x26] + iVar27 >> auVar32;
  coeff[0x27] = coeff[0x27] + iVar27 >> auVar32;
  coeff[0x28] = coeff[0x28] + iVar27 >> auVar32;
  coeff[0x29] = coeff[0x29] + iVar27 >> auVar32;
  coeff[0x2a] = coeff[0x2a] + iVar27 >> auVar32;
  coeff[0x2b] = coeff[0x2b] + iVar27 >> auVar32;
  coeff[0x2c] = coeff[0x2c] + iVar27 >> auVar32;
  coeff[0x2d] = coeff[0x2d] + iVar27 >> auVar32;
  coeff[0x2e] = coeff[0x2e] + iVar27 >> auVar32;
  coeff[0x2f] = coeff[0x2f] + iVar27 >> auVar32;
  coeff[0x30] = coeff[0x30] + iVar27 >> auVar32;
  coeff[0x31] = coeff[0x31] + iVar27 >> auVar32;
  coeff[0x32] = coeff[0x32] + iVar27 >> auVar32;
  coeff[0x33] = coeff[0x33] + iVar27 >> auVar32;
  coeff[0x34] = coeff[0x34] + iVar27 >> auVar32;
  coeff[0x35] = coeff[0x35] + iVar27 >> auVar32;
  coeff[0x36] = coeff[0x36] + iVar27 >> auVar32;
  coeff[0x37] = coeff[0x37] + iVar27 >> auVar32;
  coeff[0x38] = coeff[0x38] + iVar27 >> auVar32;
  coeff[0x39] = coeff[0x39] + iVar27 >> auVar32;
  coeff[0x3a] = coeff[0x3a] + iVar27 >> auVar32;
  coeff[0x3b] = coeff[0x3b] + iVar27 >> auVar32;
  coeff[0x3c] = iVar27 + coeff[0x3c] >> auVar32;
  coeff[0x3d] = iVar27 + coeff[0x3d] >> auVar32;
  coeff[0x3e] = iVar27 + coeff[0x3e] >> auVar32;
  coeff[0x3f] = iVar27 + coeff[0x3f] >> auVar32;
  lVar24 = 0;
  do {
    piVar2 = coeff + lVar24;
    iVar17 = piVar2[1];
    piVar3 = coeff + lVar24 + 4;
    iVar12 = piVar3[1];
    piVar4 = coeff + lVar24 + 8;
    iVar18 = *piVar4;
    iVar19 = piVar4[1];
    iVar20 = piVar4[2];
    iVar21 = piVar4[3];
    piVar4 = coeff + lVar24 + 0xc;
    iVar13 = *piVar4;
    iVar14 = piVar4[1];
    iVar15 = piVar4[2];
    iVar16 = piVar4[3];
    auVar30._0_8_ = CONCAT44(piVar3[2],piVar2[2]);
    auVar30._8_4_ = piVar2[3];
    auVar30._12_4_ = piVar3[3];
    *(ulong *)((long)local_178 + lVar24) = CONCAT44(*piVar3,*piVar2);
    *(ulong *)((long)&uStack_170 + lVar24) = CONCAT44(iVar13,iVar18);
    *(int32_t *)((long)aiStack_130 + lVar24) = iVar17;
    *(int32_t *)((long)aiStack_130 + lVar24 + 4) = iVar12;
    *(int32_t *)((long)aiStack_124 + lVar24 + -4) = iVar19;
    *(int32_t *)((long)aiStack_124 + lVar24) = iVar14;
    *(undefined8 *)((long)&local_f8 + lVar24) = auVar30._0_8_;
    *(int32_t *)((long)aiStack_f0 + lVar24) = iVar20;
    *(int32_t *)((long)aiStack_f0 + lVar24 + 4) = iVar15;
    *(long *)((long)&local_b8 + lVar24) = auVar30._8_8_;
    *(int32_t *)((long)aiStack_a4 + lVar24 + -4) = iVar21;
    *(int32_t *)((long)aiStack_a4 + lVar24) = iVar16;
    lVar24 = lVar24 + 0x10;
  } while (lVar24 != 0x40);
  lVar24 = 0;
  do {
    (*pcVar10)(local_178 + lVar24 * 4,local_78,0xc,4);
    lVar25 = 0;
    do {
      iVar12 = *(int32_t *)((long)aiStack_68 + lVar25);
      iVar13 = *(int32_t *)((long)aiStack_68 + lVar25 + 4);
      piVar2 = coeff + lVar25;
      *(undefined8 *)piVar2 = *(undefined8 *)((long)local_78 + lVar25);
      piVar2[4] = iVar12;
      piVar2[5] = iVar13;
      lVar25 = lVar25 + 0x10;
    } while (lVar25 != 0x40);
    lVar24 = lVar24 + 1;
    coeff = coeff + 4;
  } while (lVar24 != 4);
  return;
}

Assistant:

void av1_fwd_txfm2d_4x16_sse4_1(const int16_t *input, int32_t *coeff,
                                int stride, TX_TYPE tx_type, int bd) {
  __m128i in[16];
  __m128i *outcoeff128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_4X16];
  const int txw_idx = get_txw_idx(TX_4X16);
  const int txh_idx = get_txh_idx(TX_4X16);
  const int txfm_size_col = tx_size_wide[TX_4X16];
  const int txfm_size_row = tx_size_high[TX_4X16];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const fwd_transform_1d_sse4_1 col_txfm = col_highbd_txfm8x16_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = row_highbd_txfm4x4_arr[tx_type];

  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  // col transform
  load_buffer_4x16(input, in, stride, ud_flip, lr_flip, shift[0]);
  col_txfm(in, outcoeff128, bitcol, 1);
  col_txfm_8x8_rounding(outcoeff128, -shift[1]);
  transpose_8nx8n(outcoeff128, in, txfm_size_col, txfm_size_row);

  // row transform
  for (int i = 0; i < 4; i++) {
    __m128i tmp[4];
    row_txfm(in + i, tmp, bitrow, txfm_size_row >> 2);
    store_output_w4(coeff + i * 4, tmp, txfm_size_row, txfm_size_col);
  }
  (void)bd;
}